

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

Matrix<double> * __thiscall nnad::Matrix<double>::PseudoInverse_LLR(Matrix<double> *this)

{
  Matrix<double> *in_RSI;
  Matrix<double> *in_RDI;
  Matrix<double> temp_inverse;
  Matrix<double> temp;
  Matrix<double> transpose;
  Matrix<double> *output;
  Matrix<double> *in_stack_ffffffffffffffb0;
  Matrix<double> *this_00;
  
  this_00 = in_RDI;
  Matrix(in_RDI,in_RDI);
  Transpose(in_stack_ffffffffffffffb0);
  operator*(this_00,in_RSI);
  Inverse((Matrix<double> *)temp_inverse._0_8_);
  operator*(this_00,in_RSI);
  ~Matrix((Matrix<double> *)0x103857);
  ~Matrix((Matrix<double> *)0x103861);
  ~Matrix((Matrix<double> *)0x10386b);
  return in_RDI;
}

Assistant:

Matrix<T> PseudoInverse_LLR()
    {
      Matrix<T> transpose = (*this);
      transpose.Transpose();
      Matrix<T> temp = (*this) * transpose;
      Matrix<T> temp_inverse = temp.Inverse();
      Matrix<T> output = transpose * temp_inverse;
      return output;
    }